

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

bool __thiscall pbrt::SquareMatrix<2>::operator==(SquareMatrix<2> *this,SquareMatrix<2> *m2)

{
  float fVar1;
  float fVar2;
  int j;
  int i;
  SquareMatrix<2> *m2_local;
  SquareMatrix<2> *this_local;
  
  i = 0;
  do {
    if (1 < i) {
      return true;
    }
    for (j = 0; j < 2; j = j + 1) {
      fVar1 = this->m[i][j];
      fVar2 = m2->m[i][j];
      if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
        return false;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    bool operator==(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j)
                if (m[i][j] != m2.m[i][j])
                    return false;
        return true;
    }